

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void http_server_fini(nni_http_server *s)

{
  nni_mtx *mtx;
  nni_list *pnVar1;
  nni_mtx *mtx_00;
  int iVar2;
  nni_http_handler *h;
  void *item;
  
  nni_aio_stop(&s->accaio);
  nng_stream_listener_stop(s->listener);
  mtx = &s->mtx;
  nni_mtx_lock(mtx);
  iVar2 = nni_list_empty(&s->conns);
  if (iVar2 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server.c"
              ,0x2f9,"nni_list_empty(&s->conns)");
  }
  nng_stream_listener_free(s->listener);
  pnVar1 = &s->handlers;
  h = (nni_http_handler *)nni_list_first(pnVar1);
  while (h != (nni_http_handler *)0x0) {
    nni_list_remove(pnVar1,h);
    nni_http_handler_fini(h);
    h = (nni_http_handler *)nni_list_first(pnVar1);
  }
  nni_mtx_unlock(mtx);
  mtx_00 = &s->errors_mtx;
  nni_mtx_lock(mtx_00);
  pnVar1 = &s->errors;
  item = nni_list_first(pnVar1);
  while (item != (void *)0x0) {
    nni_list_remove(pnVar1,item);
    nni_strfree(*(char **)((long)item + 0x18));
    nni_free(item,0x20);
    item = nni_list_first(pnVar1);
  }
  nni_mtx_unlock(mtx_00);
  nni_mtx_fini(mtx_00);
  nni_aio_fini(&s->accaio);
  nni_mtx_fini(mtx);
  nni_strfree(s->hostname);
  nni_free(s,0x328);
  return;
}

Assistant:

static void
http_server_fini(nni_http_server *s)
{
	nni_http_handler *h;
	http_error       *epage;

	nni_aio_stop(&s->accaio);
	nng_stream_listener_stop(s->listener);

	nni_mtx_lock(&s->mtx);
	NNI_ASSERT(nni_list_empty(&s->conns));
	nng_stream_listener_free(s->listener);
	while ((h = nni_list_first(&s->handlers)) != NULL) {
		nni_list_remove(&s->handlers, h);
		nni_http_handler_fini(h);
	}
	nni_mtx_unlock(&s->mtx);
	nni_mtx_lock(&s->errors_mtx);
	while ((epage = nni_list_first(&s->errors)) != NULL) {
		nni_list_remove(&s->errors, epage);
		nni_strfree(epage->body);
		NNI_FREE_STRUCT(epage);
	}
	nni_mtx_unlock(&s->errors_mtx);
	nni_mtx_fini(&s->errors_mtx);

	nni_aio_fini(&s->accaio);
	nni_mtx_fini(&s->mtx);
	nni_strfree(s->hostname);
	NNI_FREE_STRUCT(s);
}